

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionPosition::Estimate_boundingbox
          (ChFunctionPosition *this,ChVector<double> *pmin,ChVector<double> *pmax)

{
  double dVar1;
  double smax;
  double smin;
  ChVector<double> mp;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  pmin->m_data[2] = 1e+20;
  pmin->m_data[1] = 1e+20;
  pmin->m_data[0] = 1e+20;
  pmax->m_data[2] = -1e+20;
  pmax->m_data[1] = -1e+20;
  pmax->m_data[0] = -1e+20;
  (*this->_vptr_ChFunctionPosition[6])(this,&local_48,&local_50);
  if (local_48 < local_50) {
    dVar1 = local_48;
    do {
      (*this->_vptr_ChFunctionPosition[3])(&local_40,this);
      if (local_40 < pmin->m_data[0]) {
        pmin->m_data[0] = local_40;
      }
      if (local_38 < pmin->m_data[1]) {
        pmin->m_data[1] = local_38;
      }
      if (local_30 < pmin->m_data[2]) {
        pmin->m_data[2] = local_30;
      }
      if (pmax->m_data[0] < local_40) {
        pmax->m_data[0] = local_40;
      }
      if (pmax->m_data[1] < local_38) {
        pmax->m_data[1] = local_38;
      }
      if (pmax->m_data[2] < local_30) {
        pmax->m_data[2] = local_30;
      }
      dVar1 = dVar1 + (local_50 - local_48) / 100.0;
    } while (dVar1 < local_50);
  }
  return;
}

Assistant:

void ChFunctionPosition::Estimate_boundingbox(ChVector<>& pmin, ChVector<>& pmax) const {
    pmin.x() = pmin.y() = pmin.z() =  1e20;
    pmax.x() = pmax.y() = pmax.z() = -1e20;
	double smin, smax;
	this->Estimate_s_domain(smin, smax);
    for (double ms = smin; ms < smax; ms += (smax - smin) / 100.0) {
		ChVector<> mp = this->Get_p(ms);
        if (mp.x() < pmin.x())
            pmin.x() = mp.x();
		if (mp.y() < pmin.y())
            pmin.y() = mp.y();
		if (mp.z() < pmin.z())
            pmin.z() = mp.z();
		if (mp.x() > pmax.x())
            pmax.x() = mp.x();
		if (mp.y() > pmax.y())
            pmax.y() = mp.y();
		if (mp.z() > pmax.z())
            pmax.z() = mp.z();
    }
}